

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O3

string * __thiscall
YAML::Exp::Escape_abi_cxx11_(string *__return_storage_ptr__,Exp *this,Stream *in)

{
  char cVar1;
  byte __rhs;
  Exception *this_00;
  uint uVar2;
  int codeLength;
  char *pcVar3;
  Stream *in_00;
  char *pcVar4;
  stringstream msg;
  Mark local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream local_1a8 [392];
  
  cVar1 = YAML::Stream::get((Stream *)this);
  __rhs = YAML::Stream::get((Stream *)this);
  if (__rhs == 0x27 && cVar1 == '\'') {
LAB_0070d47e:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "\'";
    pcVar3 = "";
    goto LAB_0070d493;
  }
  if (__rhs < 0x5c) {
    if (0x2e < __rhs) {
      uVar2 = __rhs - 0x4c;
      if (uVar2 < 10) {
        codeLength = (&switchD_0070d530::switchdataD_0075b4a4)[uVar2] + 0x75b4a4;
        switch((uint)__rhs) {
        case 0x4c:
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar4 = anon_var_dwarf_1b84244;
          pcVar3 = anon_var_dwarf_1b84244 + 3;
          break;
        default:
switchD_0070d4cf_caseD_5d:
          std::__cxx11::stringstream::stringstream(local_1a8);
          this_00 = (Exception *)__cxa_allocate_exception(0x40);
          local_1f8._0_8_ = *(undefined8 *)(this + 8);
          local_1f8.column = *(int *)(this + 0x10);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e8,"unknown escape character: ","");
          std::operator+(&local_1c8,&local_1e8,__rhs);
          Exception::Exception(this_00,&local_1f8,&local_1c8);
          *(undefined ***)this_00 = &PTR__BadFile_008779d0;
          __cxa_throw(this_00,&ParserException::typeinfo,BadFile::~BadFile);
        case 0x4e:
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar4 = anon_var_dwarf_1b84230;
          pcVar3 = anon_var_dwarf_1b84230 + 1;
          break;
        case 0x50:
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar4 = anon_var_dwarf_1b8425a;
          pcVar3 = anon_var_dwarf_1b8425a + 3;
          break;
        case 0x55:
          in_00 = (Stream *)0x8;
          goto LAB_0070d6ec;
        }
      }
      else {
        if (__rhs != 0x2f) {
          if (__rhs == 0x30) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
            return __return_storage_ptr__;
          }
          goto switchD_0070d4cf_caseD_5d;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "/";
        pcVar3 = "";
      }
      goto LAB_0070d493;
    }
    if (0x21 < __rhs) {
      if (__rhs == 0x22) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "\"";
        pcVar3 = "";
        goto LAB_0070d493;
      }
      if (__rhs != 0x27) goto switchD_0070d4cf_caseD_5d;
      goto LAB_0070d47e;
    }
    if (__rhs != 9) {
      if (__rhs != 0x20) goto switchD_0070d4cf_caseD_5d;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = " ";
      pcVar3 = "";
      goto LAB_0070d493;
    }
switchD_0070d4cf_caseD_74:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "\t";
    pcVar3 = "";
    goto LAB_0070d493;
  }
  codeLength = 0x75b4cc;
  switch(__rhs) {
  case 0x5c:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "\\";
    pcVar3 = "";
    break;
  default:
    goto switchD_0070d4cf_caseD_5d;
  case 0x5f:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = anon_var_dwarf_1b8423a;
    pcVar3 = anon_var_dwarf_1b8423a + 1;
    break;
  case 0x61:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "\a";
    pcVar3 = "";
    break;
  case 0x62:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "\b";
    pcVar3 = "";
    break;
  case 0x65:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "\x1b";
    pcVar3 = "";
    break;
  case 0x66:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "\f";
    pcVar3 = "";
    break;
  case 0x6e:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "\n";
    pcVar3 = "";
    break;
  case 0x72:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "\r";
    pcVar3 = "";
    break;
  case 0x74:
    goto switchD_0070d4cf_caseD_74;
  case 0x75:
    in_00 = (Stream *)0x4;
    goto LAB_0070d6ec;
  case 0x76:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "\v";
    pcVar3 = "";
    break;
  case 0x78:
    in_00 = (Stream *)0x2;
LAB_0070d6ec:
    Escape_abi_cxx11_(__return_storage_ptr__,this,in_00,codeLength);
    return __return_storage_ptr__;
  }
LAB_0070d493:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string Escape(Stream& in) {
  // eat slash
  char escape = in.get();

  // switch on escape character
  char ch = in.get();

  // first do single quote, since it's easier
  if (escape == '\'' && ch == '\'')
    return "\'";

  // now do the slash (we're not gonna check if it's a slash - you better pass
  // one!)
  switch (ch) {
    case '0':
      return std::string(1, '\x00');
    case 'a':
      return "\x07";
    case 'b':
      return "\x08";
    case 't':
    case '\t':
      return "\x09";
    case 'n':
      return "\x0A";
    case 'v':
      return "\x0B";
    case 'f':
      return "\x0C";
    case 'r':
      return "\x0D";
    case 'e':
      return "\x1B";
    case ' ':
      return R"( )";
    case '\"':
      return "\"";
    case '\'':
      return "\'";
    case '\\':
      return "\\";
    case '/':
      return "/";
    case 'N':
      return "\x85";
    case '_':
      return "\xA0";
    case 'L':
      return "\xE2\x80\xA8";  // LS (#x2028)
    case 'P':
      return "\xE2\x80\xA9";  // PS (#x2029)
    case 'x':
      return Escape(in, 2);
    case 'u':
      return Escape(in, 4);
    case 'U':
      return Escape(in, 8);
  }

  std::stringstream msg;
  throw ParserException(in.mark(), std::string(ErrorMsg::INVALID_ESCAPE) + ch);
}